

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O1

int nni_posix_pfd_arm(nni_posix_pfd *pfd,uint events)

{
  nni_posix_pollq *pnVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  undefined1 local_30 [8];
  epoll_event ev;
  
  pnVar1 = pfd->pq;
  uVar2 = nni_atomic_or(&pfd->events,events);
  local_30._0_4_ = uVar2 | events | 0x40000000;
  local_30._4_4_ = SUB84(pfd,0);
  ev.events = (uint32_t)((ulong)pfd >> 0x20);
  iVar3 = pnVar1->epfd;
  if (pfd->added == false) {
    iVar3 = epoll_ctl(iVar3,1,pfd->fd,(epoll_event *)local_30);
    if (iVar3 != 0) goto LAB_0011a9a5;
    pfd->added = true;
  }
  else {
    iVar3 = epoll_ctl(iVar3,3,pfd->fd,(epoll_event *)local_30);
    if (iVar3 != 0) {
LAB_0011a9a5:
      piVar4 = __errno_location();
      iVar3 = nni_plat_errno(*piVar4);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

int
nni_posix_pfd_arm(nni_posix_pfd *pfd, unsigned events)
{
	nni_posix_pollq *pq = pfd->pq;
	int              rv;

	// NB: We depend on epoll event flags being the same as their POLLIN
	// equivalents.  I.e. POLLIN == EPOLLIN, POLLOUT == EPOLLOUT, and so
	// forth.  This turns out to be true both for Linux and the illumos
	// epoll implementation.

	struct epoll_event ev;
	events |= nni_atomic_or(&pfd->events, (int) events);

	memset(&ev, 0, sizeof(ev));
	ev.events   = events | EPOLLONESHOT;
	ev.data.ptr = pfd;

	// if this fails the system is probably out of memory - it will fail in
	// arm with ENOENT most likely.
	if (!pfd->added) {
		rv = epoll_ctl(pq->epfd, EPOLL_CTL_ADD, pfd->fd, &ev);
		if (rv == 0) {
			pfd->added = true;
		}
	} else {
		rv = epoll_ctl(pq->epfd, EPOLL_CTL_MOD, pfd->fd, &ev);
	}
	if (rv != 0) {
		rv = nni_plat_errno(errno);
	}
	return (rv);
}